

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_convolutiondepthwise_batchnorm(NetOptimize *this)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppLVar4;
  reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  float *pfVar8;
  reference pvVar9;
  Mat *pMVar10;
  Mat *pMVar11;
  reference pvVar12;
  int iVar13;
  long in_RDI;
  double dVar14;
  int top_blob_index_final;
  int j_1;
  float *conv_weight_outch;
  int i_2;
  float *bias;
  float *weight;
  int weight_per_outch;
  float sqrt_var;
  int i_1;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  float eps;
  int channels;
  BatchNorm *batchnorm;
  ConvolutionDepthWise *convolutiondepthwise;
  int j;
  int top_blob_index;
  int i;
  int layer_count;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  Mat *in_stack_fffffffffffffe70;
  Mat *in_stack_fffffffffffffe78;
  float _v;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  float *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe94;
  int local_f4;
  int local_e4;
  int local_80;
  vector<float,_std::allocator<float>_> local_78 [2];
  vector<float,_std::allocator<float>_> local_48;
  float local_30;
  int local_2c;
  value_type local_28;
  value_type local_20;
  int local_18;
  value_type local_14;
  int local_10;
  int local_c;
  
  sVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28));
  local_c = (int)sVar3;
  local_10 = 0;
  do {
    if (local_c <= local_10) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
               (long)local_10);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe70,
                            (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    if (!bVar1) {
      ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
                           (long)local_10);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->tops,0);
      local_14 = *pvVar5;
      local_18 = local_10;
      do {
        do {
          do {
            local_18 = local_18 + 1;
            if (local_c <= local_18) goto LAB_0011530b;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
                       (long)local_18);
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffe70,
                                    (char *)CONCAT44(in_stack_fffffffffffffe6c,
                                                     in_stack_fffffffffffffe68));
          } while (bVar1);
          ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x28),(long)local_18);
          sVar3 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar4)->bottoms);
        } while (sVar3 != 1);
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_18);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->bottoms,0);
      } while (*pvVar5 != local_14);
LAB_0011530b:
      if (local_18 != local_c) {
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_10);
        local_20 = *ppLVar4;
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_18);
        __stream = _stderr;
        local_28 = *ppLVar4;
        uVar6 = std::__cxx11::string::c_str();
        uVar7 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_convolutiondepthwise_batchnorm %s %s\n",uVar6,uVar7);
        local_2c = *(int *)&local_28[1]._vptr_Layer;
        local_30 = *(float *)((long)&local_28[1]._vptr_Layer + 4);
        std::allocator<float>::allocator((allocator<float> *)0x115410);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (size_type)in_stack_fffffffffffffe88,
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        std::allocator<float>::~allocator((allocator<float> *)0x11543c);
        std::allocator<float>::allocator((allocator<float> *)0x11545b);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (size_type)in_stack_fffffffffffffe88,
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        std::allocator<float>::~allocator((allocator<float> *)0x115481);
        for (local_80 = 0; local_80 < local_2c; local_80 = local_80 + 1) {
          pfVar8 = ncnn::Mat::operator[]((Mat *)&local_28[2].one_blob_only,local_80);
          dVar14 = std::sqrt((double)(ulong)(uint)(*pfVar8 + local_30));
          pfVar8 = ncnn::Mat::operator[]((Mat *)((long)&local_28[2].name.field_2 + 8),local_80);
          in_stack_fffffffffffffe84 = *pfVar8;
          pfVar8 = ncnn::Mat::operator[]((Mat *)&local_28[1].one_blob_only,local_80);
          in_stack_fffffffffffffe94 = *pfVar8;
          pfVar8 = ncnn::Mat::operator[]((Mat *)((long)&local_28[1].name.field_2 + 8),local_80);
          in_stack_fffffffffffffe84 =
               in_stack_fffffffffffffe84 - (in_stack_fffffffffffffe94 * *pfVar8) / SUB84(dVar14,0);
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&local_48,(long)local_80);
          *pvVar9 = in_stack_fffffffffffffe84;
          in_stack_fffffffffffffe88 =
               ncnn::Mat::operator[]((Mat *)&local_28[1].one_blob_only,local_80);
          in_stack_fffffffffffffe80 = *in_stack_fffffffffffffe88 / SUB84(dVar14,0);
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](local_78,(long)local_80);
          *pvVar9 = in_stack_fffffffffffffe80;
        }
        if (*(int *)((long)&local_20[1].type.field_2 + 4) == 0) {
          *(undefined4 *)((long)&local_20[1].type.field_2 + 4) = 1;
          ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                         (size_t)in_stack_fffffffffffffe70,
                         (Allocator *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
          ;
          ncnn::Mat::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
          _v = (float)((ulong)in_stack_fffffffffffffe78 >> 0x20);
          ncnn::Mat::~Mat((Mat *)0x11570c);
          ncnn::Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),_v);
        }
        iVar2 = *(int *)((long)&local_20[1].type.field_2 + 8) / local_2c;
        pMVar10 = (Mat *)ncnn::Mat::operator_cast_to_float_
                                   ((Mat *)&local_20[1].tops.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage);
        in_stack_fffffffffffffe78 = pMVar10;
        pMVar11 = (Mat *)ncnn::Mat::operator_cast_to_float_
                                   ((Mat *)&local_20[2].name._M_string_length);
        in_stack_fffffffffffffe70 = pMVar11;
        for (local_e4 = 0; local_e4 < local_2c; local_e4 = local_e4 + 1) {
          iVar13 = iVar2 * local_e4;
          for (local_f4 = 0; local_f4 < iVar2; local_f4 = local_f4 + 1) {
            pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](local_78,(long)local_e4)
            ;
            *(float *)((long)&pMVar10->data + (long)local_f4 * 4 + (long)iVar13 * 4) =
                 *pvVar9 * *(float *)((long)&pMVar10->data + (long)local_f4 * 4 + (long)iVar13 * 4);
          }
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&local_48,(long)local_e4);
          *(float *)((_Alloc_hider *)&pMVar11->data + (long)local_e4 * 4) =
               *pvVar9 + *(float *)((_Alloc_hider *)&pMVar11->data + (long)local_e4 * 4);
        }
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_28->tops,0);
        iVar2 = *pvVar5;
        in_stack_fffffffffffffe68 = iVar2;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_20->tops,0);
        *pvVar5 = in_stack_fffffffffffffe68;
        in_stack_fffffffffffffe6c = local_10;
        pvVar12 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x10),
                             (long)iVar2);
        pvVar12->producer = in_stack_fffffffffffffe6c;
        std::__cxx11::string::operator=((string *)&local_28->type,"ncnnfused");
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_batchnorm()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - BatchNorm to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_convolutiondepthwise_batchnorm %s %s\n", convolutiondepthwise->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i=0; i<channels; i++)
            {
                float sqrt_var = sqrt(batchnorm->var_data[i] + eps);
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (convolutiondepthwise->bias_term == 0)
            {
                // init bias as zero
                convolutiondepthwise->bias_term = 1;
                convolutiondepthwise->bias_data = ncnn::Mat(channels);
                convolutiondepthwise->bias_data.fill(0.f);
            }

            const int weight_per_outch = convolutiondepthwise->weight_data_size / channels;

            float* weight = convolutiondepthwise->weight_data;
            float* bias = convolutiondepthwise->bias_data;
            for (int i=0; i<channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j=0; j<weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] += a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}